

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

Type * __thiscall
soul::AST::TypeMetaFunction::getSourceType(Type *__return_storage_ptr__,TypeMetaFunction *this)

{
  Expression *pEVar1;
  Structure *pSVar2;
  Category CVar3;
  bool bVar4;
  bool bVar5;
  BoundedIntSize BVar6;
  int iVar7;
  long lVar8;
  vector<soul::Type,_std::allocator<soul::Type>_> types;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  vector<soul::Type,_std::allocator<soul::Type>_> local_78;
  long local_60;
  CompileMessage local_58;
  
  pEVar1 = (this->source).object;
  if (pEVar1->kind == type) {
    iVar7 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    lVar8 = 0x28;
    if ((char)iVar7 != '\0') goto LAB_001fc01c;
  }
  (*(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[8])(&local_60);
  if (local_60 != 0) {
    if (*(EndpointDetails **)(local_60 + 0x38) == (EndpointDetails *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    EndpointDetails::getResolvedDataTypes(&local_78,*(EndpointDetails **)(local_60 + 0x38));
    if ((long)local_78.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_78.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
              super__Vector_impl_data._M_start != 0x18) {
      CompileMessageHelpers::createMessage<>
                (&local_58,syntax,error,"This endpoint has more than one type");
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_58,false);
    }
    CVar3 = (local_78.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->arrayElementCategory;
    bVar4 = (local_78.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->isRef;
    bVar5 = (local_78.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->isConstant;
    __return_storage_ptr__->category =
         (local_78.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
          super__Vector_impl_data._M_start)->category;
    __return_storage_ptr__->arrayElementCategory = CVar3;
    __return_storage_ptr__->isRef = bVar4;
    __return_storage_ptr__->isConstant = bVar5;
    (__return_storage_ptr__->primitiveType).type =
         ((local_78.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->primitiveType).type;
    BVar6 = (local_78.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->arrayElementBoundingSize;
    __return_storage_ptr__->boundingSize =
         (local_78.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
          super__Vector_impl_data._M_start)->boundingSize;
    __return_storage_ptr__->arrayElementBoundingSize = BVar6;
    pSVar2 = ((local_78.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->structure).object;
    (__return_storage_ptr__->structure).object = pSVar2;
    if (pSVar2 != (Structure *)0x0) {
      (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
    }
    std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_78);
    if (local_60 != 0) {
      return __return_storage_ptr__;
    }
  }
  lVar8 = 0x20;
LAB_001fc01c:
  (**(code **)((long)(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject +
              lVar8))(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Type getSourceType() const
        {
            if (isResolvedAsType (source.get()))
                return source->resolveAsType();

            if (auto endpoint = source->getAsEndpoint())
            {
                auto types = endpoint->getDetails().getResolvedDataTypes();

                if (types.size() == 1)
                    return types.front();

                context.throwError (Errors::endpointHasMultipleTypes());
            }

            return source->getResultType();
        }